

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eeep_fruinfo.c
# Opt level: O3

void IpmiFruBuildBoardInfoArea(EeePModuleInfo_t *info)

{
  int iVar1;
  int iVar2;
  size_t sVar3;
  int iVar4;
  uint8_t *puVar5;
  uint8_t *value;
  char cVar6;
  uint8_t *puVar7;
  uint8_t *puVar8;
  
  board_info_area.area.format_version = '\x01';
  board_info_area.area.language_code = '\x19';
  board_info_area.area.mfg_date_time[0] = '\0';
  board_info_area.area.mfg_date_time[1] = '\0';
  board_info_area.area.mfg_date_time[2] = '\0';
  value = info->Handles[0].b + (ulong)info->ContainedHndls * 2;
  if (info->Manufacturer == '\0') {
LAB_00101dad:
    board_info_area.area.variable_part[0] = 0xc0;
LAB_00101db4:
    puVar8 = board_info_area.pad;
  }
  else {
    cVar6 = info->Manufacturer + 0xff;
    puVar8 = value;
    if (cVar6 != '\0') {
      do {
        puVar7 = puVar8;
        sVar3 = strlen((char *)puVar7);
        puVar8 = puVar7 + sVar3 + 1;
        cVar6 = cVar6 + -1;
      } while (cVar6 != '\0');
      if (puVar7 == (uint8_t *)0x0) goto LAB_00101dad;
    }
    sVar3 = strlen((char *)puVar8);
    iVar1 = (int)sVar3;
    iVar4 = 0x3f;
    if (iVar1 < 0x3f) {
      iVar4 = iVar1;
    }
    iVar2 = 2;
    if (iVar1 != 1) {
      iVar2 = iVar4;
    }
    board_info_area.area.variable_part[0] = (char)iVar2 + 0xc0;
    if (iVar2 == 0) goto LAB_00101db4;
    memcpy(board_info_area.pad,puVar8,(long)iVar2);
    puVar8 = board_info_area.pad + iVar2;
  }
  if (info->Product == '\0') {
LAB_00101e2b:
    *puVar8 = 0xc0;
    puVar8 = puVar8 + 1;
  }
  else {
    cVar6 = info->Product + 0xff;
    puVar7 = value;
    if (cVar6 != '\0') {
      do {
        puVar5 = puVar7;
        sVar3 = strlen((char *)puVar5);
        puVar7 = puVar5 + sVar3 + 1;
        cVar6 = cVar6 + -1;
      } while (cVar6 != '\0');
      if (puVar5 == (uint8_t *)0x0) goto LAB_00101e2b;
    }
    sVar3 = strlen((char *)puVar7);
    iVar1 = (int)sVar3;
    iVar4 = 0x3f;
    if (iVar1 < 0x3f) {
      iVar4 = iVar1;
    }
    iVar2 = 2;
    if (iVar1 != 1) {
      iVar2 = iVar4;
    }
    *puVar8 = (char)iVar2 + 0xc0;
    puVar8 = puVar8 + 1;
    if (iVar2 != 0) {
      memcpy(puVar8,puVar7,(long)iVar2);
      puVar8 = puVar8 + iVar2;
    }
  }
  if (info->SerialNumber == '\0') {
LAB_00101ea2:
    *puVar8 = 0xc0;
    puVar8 = puVar8 + 1;
  }
  else {
    cVar6 = info->SerialNumber + 0xff;
    puVar7 = value;
    if (cVar6 != '\0') {
      do {
        puVar5 = puVar7;
        sVar3 = strlen((char *)puVar5);
        puVar7 = puVar5 + sVar3 + 1;
        cVar6 = cVar6 + -1;
      } while (cVar6 != '\0');
      if (puVar5 == (uint8_t *)0x0) goto LAB_00101ea2;
    }
    sVar3 = strlen((char *)puVar7);
    iVar1 = (int)sVar3;
    iVar4 = 0x3f;
    if (iVar1 < 0x3f) {
      iVar4 = iVar1;
    }
    iVar2 = 2;
    if (iVar1 != 1) {
      iVar2 = iVar4;
    }
    *puVar8 = (char)iVar2 + 0xc0;
    puVar8 = puVar8 + 1;
    if (iVar2 != 0) {
      memcpy(puVar8,puVar7,(long)iVar2);
      puVar8 = puVar8 + iVar2;
    }
  }
  puVar8[0] = 0xc0;
  puVar8[1] = 0xc0;
  puVar8 = puVar8 + 2;
  if (info->Version != '\0') {
    cVar6 = info->Version + 0xff;
    puVar7 = value;
    if (cVar6 != '\0') {
      do {
        puVar5 = puVar7;
        sVar3 = strlen((char *)puVar5);
        puVar7 = puVar5 + sVar3 + 1;
        cVar6 = cVar6 + -1;
      } while (cVar6 != '\0');
      if (puVar5 == (uint8_t *)0x0) goto LAB_00101ef5;
    }
    puVar8 = IpmiFruAddCustomString(puVar8,"VERSION",(char *)puVar7);
  }
LAB_00101ef5:
  if (info->Location != '\0') {
    cVar6 = info->Location + 0xff;
    puVar7 = value;
    if (cVar6 != '\0') {
      do {
        puVar5 = puVar7;
        sVar3 = strlen((char *)puVar5);
        puVar7 = puVar5 + sVar3 + 1;
        cVar6 = cVar6 + -1;
      } while (cVar6 != '\0');
      if (puVar5 == (uint8_t *)0x0) goto LAB_00101f37;
    }
    puVar8 = IpmiFruAddCustomString(puVar8,"LOCATION",(char *)puVar7);
  }
LAB_00101f37:
  if (info->AssetTag != '\0') {
    cVar6 = info->AssetTag + 0xff;
    if (cVar6 != '\0') {
      do {
        puVar7 = value;
        sVar3 = strlen((char *)puVar7);
        value = puVar7 + sVar3 + 1;
        cVar6 = cVar6 + -1;
      } while (cVar6 != '\0');
      if (puVar7 == (uint8_t *)0x0) goto LAB_00101f75;
    }
    puVar8 = IpmiFruAddCustomString(puVar8,"ASSET_TAG",(char *)value);
  }
LAB_00101f75:
  board_info_area_size = IpmiFruFinalizeArea((uint8_t *)&board_info_area,(int)puVar8 - 0x105964);
  return;
}

Assistant:

void IpmiFruBuildBoardInfoArea(EeePModuleInfo_t *info)
{
    board_info_area.area.format_version = IPMI_FRUINFO_FORMAT_VERSION;
    board_info_area.area.language_code = IPMI_FRUINFO_LANGUAGE_CODE_ENGLISH;
    board_info_area.area.mfg_date_time[0] = 0;
    board_info_area.area.mfg_date_time[1] = 0;
    board_info_area.area.mfg_date_time[2] = 0;
    uint8_t *varp = board_info_area.area.variable_part;

    void *strstart = info->Handles + info->ContainedHndls;
    const char *str;
    //  Manufacturer
    if (str = GetSmbiosString(info->Manufacturer, strstart)) {
        varp = IpmiFruAddString(varp, str);
    } else {
        *varp++ = 0xC0;
    }
    //  Product name
    if (str = GetSmbiosString(info->Product, strstart)) {
        varp = IpmiFruAddString(varp, str);
    } else {
        *varp++ = 0xC0;
    }
    //  Serial number
    if (str = GetSmbiosString(info->SerialNumber, strstart)) {
        varp = IpmiFruAddString(varp, str);
    } else {
        *varp++ = 0xC0;
    }
    //  Part number - not specified
    *varp++ = 0xC0;
    //  FRU File ID - not specified
    *varp++ = 0xC0;
    //  Version as custom string
    if (str = GetSmbiosString(info->Version, strstart)) {
        varp = IpmiFruAddCustomString(varp, "VERSION", str);
    }
    //  Location as custom string
    if (str = GetSmbiosString(info->Location, strstart)) {
        varp = IpmiFruAddCustomString(varp, "LOCATION", str);
    }
    //  Asset tag as custom string
    if (str = GetSmbiosString(info->AssetTag, strstart)) {
        varp = IpmiFruAddCustomString(varp, "ASSET_TAG", str);
    }
    uint8_t *board_area_ptr = (uint8_t *)&board_info_area;
    board_info_area_size = IpmiFruFinalizeArea(board_area_ptr, varp-board_area_ptr);
}